

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O2

void pele::physics::turbinflow::TurbInflow::set_turb
               (int normDir,int transDir1,int transDir2,FArrayBox *v,FArrayBox *data,int dcomp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  int local_e8 [4];
  long local_d8;
  long local_d0;
  double *local_c8;
  long local_c0;
  long local_b8;
  double *local_b0;
  double *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  long local_70;
  double *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  iVar1 = (v->super_BaseFab<double>).domain.smallend.vect[0];
  iVar2 = (v->super_BaseFab<double>).domain.smallend.vect[1];
  local_a0 = (long)iVar2;
  uVar3 = (v->super_BaseFab<double>).domain.bigend.vect[0];
  local_78 = (ulong)uVar3;
  iVar8 = uVar3 + 1;
  iVar4 = (v->super_BaseFab<double>).domain.bigend.vect[1];
  local_70 = (long)iVar4;
  iVar10 = iVar8 - iVar1;
  local_d0 = (long)((iVar4 - iVar2) + 1) * (long)iVar10;
  iVar2 = (data->super_BaseFab<double>).domain.smallend.vect[0];
  local_38 = (long)iVar2;
  local_40 = (long)(((data->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  iVar2 = (data->super_BaseFab<double>).domain.smallend.vect[1];
  local_48 = (long)iVar2;
  local_50 = (((data->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1) * local_40;
  iVar2 = (data->super_BaseFab<double>).domain.smallend.vect[2];
  local_58 = (long)iVar2;
  local_b8 = (((data->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1) * local_50;
  local_60 = (data->super_BaseFab<double>).dptr + dcomp * local_b8;
  local_80 = (long)iVar8 * 8 + (long)iVar1 * -8;
  pdVar19 = (v->super_BaseFab<double>).dptr;
  iVar2 = (v->super_BaseFab<double>).domain.smallend.vect[2];
  iVar4 = (v->super_BaseFab<double>).domain.bigend.vect[2];
  local_98 = (long)iVar4;
  local_d8 = (long)transDir1;
  local_c0 = (long)transDir2;
  local_88 = (long)normDir;
  local_90 = local_b8 * local_d8;
  lVar15 = local_b8 * local_c0;
  local_b8 = local_b8 * local_88;
  lVar11 = ((iVar4 - iVar2) + 1) * local_d0;
  local_b0 = pdVar19 + lVar11;
  local_a8 = pdVar19 + lVar11 * 2;
  local_d0 = local_d0 * 8;
  for (lVar11 = (long)iVar2; lVar9 = local_a0, pdVar14 = local_a8, pdVar18 = local_b0,
      local_c8 = pdVar19, lVar11 <= local_98; lVar11 = lVar11 + 1) {
    for (; lVar7 = local_88, lVar6 = local_90, lVar5 = local_c0, lVar9 <= local_70;
        lVar9 = lVar9 + 1) {
      if (iVar1 <= (int)local_78) {
        lVar13 = 0;
        do {
          local_e8[2] = 0;
          local_e8[0] = 0;
          local_e8[1] = 0;
          local_e8[local_d8] = iVar1 + (int)lVar13;
          local_e8[lVar5] = (int)lVar9;
          local_e8[lVar7] = (int)lVar11;
          lVar16 = local_e8[0] - local_38;
          lVar12 = (local_e8[1] - local_48) * local_40;
          lVar17 = (local_e8[2] - local_58) * local_50;
          local_60[lVar12 + lVar16 + lVar17 + lVar6] = pdVar19[lVar13];
          local_60[lVar12 + lVar16 + lVar17 + lVar15] = pdVar18[lVar13];
          local_60[lVar12 + lVar16 + lVar17 + local_b8] = pdVar14[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar10 != (int)lVar13);
      }
      pdVar19 = (double *)((long)pdVar19 + local_80);
      pdVar14 = (double *)((long)pdVar14 + local_80);
      pdVar18 = (double *)((long)pdVar18 + local_80);
    }
    local_a8 = (double *)((long)local_a8 + local_d0);
    local_b0 = (double *)((long)local_b0 + local_d0);
    pdVar19 = (double *)((long)local_c8 + local_d0);
  }
  return;
}

Assistant:

void
TurbInflow::set_turb(
  int normDir,
  int transDir1,
  int transDir2,
  amrex::FArrayBox& v,
  amrex::FArrayBox& data,
  const int dcomp)
{
  // copy velocity fluctuations from plane into data
  const auto& box = v.box(); // z-normal plane
  const auto& v_in = v.array();
  const auto& v_out = data.array(dcomp);

  amrex::ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    // From z-normal box index to data box index
    int idx[3] = {0};
    idx[transDir1] = i;
    idx[transDir2] = j;
    idx[normDir] = k;
    v_out(idx[0], idx[1], idx[2], transDir1) =
      v_in(i, j, k, 0); // transverse velocity 1
    v_out(idx[0], idx[1], idx[2], transDir2) =
      v_in(i, j, k, 1); // transverse velocity 2
    v_out(idx[0], idx[1], idx[2], normDir) =
      v_in(i, j, k, 2); // normal velocity
  });
}